

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.c
# Opt level: O0

void new_light_source(level *lev,xchar x,xchar y,int range,int type,void *id)

{
  ls_t *plVar1;
  light_source *ls;
  void *id_local;
  int type_local;
  int range_local;
  xchar y_local;
  xchar x_local;
  level *lev_local;
  
  if ((range < 0x10) && (0 < range)) {
    plVar1 = (ls_t *)malloc(0x18);
    plVar1->next = lev->lev_lights;
    plVar1->x = x;
    plVar1->y = y;
    plVar1->range = (short)range;
    plVar1->type = (short)type;
    plVar1->id = id;
    plVar1->flags = 0;
    lev->lev_lights = plVar1;
    vision_full_recalc = '\x01';
  }
  else {
    impossible("new_light_source:  illegal range %d",(ulong)(uint)range);
  }
  return;
}

Assistant:

void new_light_source(struct level *lev, xchar x, xchar y, int range, int type, void *id)
{
    light_source *ls;

    if (range > MAX_RADIUS || range < 1) {
	impossible("new_light_source:  illegal range %d", range);
	return;
    }

    ls = malloc(sizeof(light_source));

    ls->next = lev->lev_lights;
    ls->x = x;
    ls->y = y;
    ls->range = range;
    ls->type = type;
    ls->id = id;
    ls->flags = 0;
    lev->lev_lights = ls;

    vision_full_recalc = 1;	/* make the source show up */
}